

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O0

void measurepopcnt(uint32_t n,uint32_t iterations,bool verbose)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  undefined1 auVar4 [16];
  result_type rVar5;
  void *pvVar6;
  reference pvVar7;
  reference pvVar8;
  byte in_DL;
  uint in_ESI;
  uint in_EDI;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar14 [16];
  undefined1 in_ZMM3 [64];
  vector<double,_std::allocator<double>_> avg;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  uint64_t measured;
  uint64_t expected;
  size_t k;
  uint32_t i;
  uniform_int_distribution<int> dis;
  mt19937 gen;
  random_device rd;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  LinuxEvents<0> unified;
  unique_ptr<unsigned_short,_void_(*)(void_*)> dataholder;
  uint16_t *vdata;
  vector<int,_std::allocator<int>_> evts;
  int in_stack_ffffffffffffd628;
  int in_stack_ffffffffffffd62c;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd630;
  value_type *in_stack_ffffffffffffd638;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffd640;
  size_type in_stack_ffffffffffffd648;
  value_type vVar15;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_stack_ffffffffffffd650;
  value_type vVar16;
  random_device *in_stack_ffffffffffffd670;
  value_type vVar17;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd678;
  value_type vVar18;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd680;
  value_type vVar19;
  LinuxEvents<0> *in_stack_ffffffffffffd6a0;
  size_type __n;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  *in_stack_ffffffffffffd6a8;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *this;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_stack_ffffffffffffd6b8;
  LinuxEvents<0> *in_stack_ffffffffffffd6c0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd6c8;
  LinuxEvents<0> *in_stack_ffffffffffffd6d0;
  vector<double,_std::allocator<double>_> local_28f8 [2];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_28c8;
  uint64_t local_28b0;
  uint64_t local_28a8;
  ulong local_28a0;
  uint local_2894;
  uint64_t in_stack_ffffffffffffda30;
  __m512i *in_stack_ffffffffffffda38;
  vector<int,_std::allocator<int>_> local_28;
  byte local_9;
  uint local_8;
  uint local_4;
  
  local_9 = in_DL & 1;
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15d1f5);
  pvVar6 = malloc((ulong)local_4 * 2);
  std::unique_ptr<unsigned_short,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            ((unique_ptr<unsigned_short,_void_(*)(void_*)> *)in_stack_ffffffffffffd630,
             (pointer)CONCAT44(in_stack_ffffffffffffd62c,in_stack_ffffffffffffd628),
             (__enable_if_t<_is_lvalue_reference<void_(*)(void_*)>::value,_void_(*&&)(void_*)>)
             0x15d23a);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd630,
             (value_type_conflict4 *)CONCAT44(in_stack_ffffffffffffd62c,in_stack_ffffffffffffd628));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd630,
             (value_type_conflict4 *)CONCAT44(in_stack_ffffffffffffd62c,in_stack_ffffffffffffd628));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd630,
             (value_type_conflict4 *)CONCAT44(in_stack_ffffffffffffd62c,in_stack_ffffffffffffd628));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd630,
             (value_type_conflict4 *)CONCAT44(in_stack_ffffffffffffd62c,in_stack_ffffffffffffd628));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd630,
             (value_type_conflict4 *)CONCAT44(in_stack_ffffffffffffd62c,in_stack_ffffffffffffd628));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd630,
             (value_type_conflict4 *)CONCAT44(in_stack_ffffffffffffd62c,in_stack_ffffffffffffd628));
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffd680,in_stack_ffffffffffffd678);
  LinuxEvents<0>::LinuxEvents(in_stack_ffffffffffffd6d0,in_stack_ffffffffffffd6c8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd640);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x15d356);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)0x15d363);
  std::vector<int,_std::allocator<int>_>::size(&local_28);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            (in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
  std::random_device::random_device(in_stack_ffffffffffffd670);
  std::random_device::operator()((random_device *)0x15d39e);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            (in_stack_ffffffffffffd630,CONCAT44(in_stack_ffffffffffffd62c,in_stack_ffffffffffffd628)
            );
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffd630,in_stack_ffffffffffffd62c,
             in_stack_ffffffffffffd628);
  local_2894 = 0;
  while( true ) {
    auVar14 = in_ZMM3._0_16_;
    auVar13 = in_ZMM2._0_16_;
    auVar12 = in_ZMM1._0_16_;
    auVar11 = in_ZMM0._0_16_;
    if (local_8 <= local_2894) break;
    for (local_28a0 = 0; local_28a0 < local_4; local_28a0 = local_28a0 + 1) {
      rVar5 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)in_stack_ffffffffffffd630,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)CONCAT44(in_stack_ffffffffffffd62c,in_stack_ffffffffffffd628));
      *(short *)((long)pvVar6 + local_28a0 * 2) = (short)rVar5;
    }
    local_28a8 = popcnt_harley_seal(in_stack_ffffffffffffda38,in_stack_ffffffffffffda30);
    LinuxEvents<0>::start(in_stack_ffffffffffffd6a0);
    local_28b0 = popcnt_harley_seal(in_stack_ffffffffffffda38,in_stack_ffffffffffffda30);
    LinuxEvents<0>::end(in_stack_ffffffffffffd6c0,in_stack_ffffffffffffd6b8);
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                 *)in_stack_ffffffffffffd640,in_stack_ffffffffffffd638);
    local_2894 = local_2894 + 1;
  }
  local_4 = local_4 & 0xffffffe0;
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)in_stack_ffffffffffffd680,
           (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)in_stack_ffffffffffffd678);
  compute_mins((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                *)in_stack_ffffffffffffd678);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)in_stack_ffffffffffffd640);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)in_stack_ffffffffffffd680,
           (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)in_stack_ffffffffffffd678);
  compute_averages(in_stack_ffffffffffffd6a8);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)in_stack_ffffffffffffd640);
  printf("%-40s\t","avx512popcnt");
  if ((local_9 & 1) == 0) {
    in_stack_ffffffffffffd630 =
         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)&local_28c8;
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                        in_stack_ffffffffffffd630,0);
    auVar14 = vcvtusi2sd_avx512f(auVar11,*pvVar7);
    auVar11 = vcvtusi2sd_avx512f(auVar12,local_4);
    dVar10 = auVar14._0_8_ / auVar11._0_8_;
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                        in_stack_ffffffffffffd630,5);
    auVar12 = vcvtusi2sd_avx512f(auVar11,*pvVar7);
    auVar11 = vcvtusi2sd_avx512f(auVar13,local_4);
    printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n",dVar10,
           auVar12._0_8_ / auVar11._0_8_);
  }
  else {
    this = &local_28c8;
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (this,1);
    auVar11 = vcvtusi2sd_avx512f(auVar11,*pvVar7);
    __n = 0;
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (this,0);
    auVar12 = vcvtusi2sd_avx512f(auVar12,*pvVar7);
    auVar11._0_8_ = auVar11._0_8_ / auVar12._0_8_;
    auVar11._8_8_ = 0;
    dVar10 = auVar11._0_8_;
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (this,__n);
    auVar4 = vcvtusi2sd_avx512f(auVar11,*pvVar7);
    auVar11 = vcvtusi2sd_avx512f(auVar12,local_4);
    dVar9 = auVar4._0_8_ / auVar11._0_8_;
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (this,1);
    auVar12 = vcvtusi2sd_avx512f(auVar13,*pvVar7);
    auVar11 = vcvtusi2sd_avx512f(auVar14,local_4);
    printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, instructions per 16-bit word %4.3f \n"
           ,dVar10,dVar9,auVar12._0_8_ / auVar11._0_8_);
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&local_28c8,0);
    vVar17 = *pvVar7;
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&local_28c8,1);
    vVar18 = *pvVar7;
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&local_28c8,2);
    vVar19 = *pvVar7;
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&local_28c8,3);
    vVar3 = *pvVar7;
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&local_28c8,4);
    printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
           ,vVar17,vVar18,vVar19,vVar3,*pvVar7);
    in_stack_ffffffffffffd640 = local_28f8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_ffffffffffffd640,0);
    vVar15 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_ffffffffffffd640,1);
    vVar16 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_ffffffffffffd640,2);
    vVar1 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_ffffffffffffd640,3);
    vVar2 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_ffffffffffffd640,4);
    printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
           ,vVar15,vVar16,vVar1,vVar2,*pvVar8);
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffd640);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_ffffffffffffd640);
  std::random_device::~random_device((random_device *)0x15d988);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)in_stack_ffffffffffffd640);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_ffffffffffffd640);
  LinuxEvents<0>::~LinuxEvents((LinuxEvents<0> *)in_stack_ffffffffffffd630);
  std::unique_ptr<unsigned_short,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<unsigned_short,_void_(*)(void_*)> *)in_stack_ffffffffffffd640);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd640);
  return;
}

Assistant:

void measurepopcnt(uint32_t n, uint32_t iterations, bool verbose) {
    std::vector<int> evts;
    uint16_t* vdata = (uint16_t*)memory_allocate(n * sizeof(uint16_t));
    std::unique_ptr<uint16_t, decltype(&free)> dataholder(vdata, free);
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFFFF);

    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < n; k++) {
            vdata[k] = dis(gen); // random init.
        }
#if POSPOPCNT_SIMD_VERSION >= 6        
        uint64_t expected = popcnt_harley_seal((const __m512i*) vdata, n / (512 / 16));
        unified.start();
        uint64_t measured = popcnt_harley_seal((const __m512i*) vdata, n / (512 / 16));
        unified.end(results);
#elif POSPOPCNT_SIMD_VERSION >= 5
        uint64_t expected = popcnt_avx2((const __m256i*) vdata, n / (256 / 16));
        unified.start();
        uint64_t measured = popcnt_avx2((const __m256i*) vdata, n / (256 / 16));
        unified.end(results);
#endif
        assert(measured == expected);
        allresults.push_back(results);
    }

#if POSPOPCNT_SIMD_VERSION >= 6    
    n = n / (512 / 16) * (512 / 16);
#elif POSPOPCNT_SIMD_VERSION >= 5
    n = n / (256 / 16) * (256 / 16);
#endif

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);
#if POSPOPCNT_SIMD_VERSION >= 6 
    printf("%-40s\t","avx512popcnt");    
#elif POSPOPCNT_SIMD_VERSION >= 5
    printf("%-40s\t","avx256popcnt");  
#endif
    if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, "
               "instructions per 16-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / n, double(mins[1]) / n);
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
    } else {
        printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n", double(mins[0]) / n, double(mins[5]) / n);
    }
}